

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O1

vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> * __thiscall
adios2::format::BP5Serializer::BreakoutContiguousMetadata
          (vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *__return_storage_ptr__
          ,BP5Serializer *this,vector<char,_std::allocator<char>_> *Aggregate,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *Counts,
          vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          *UniqueMetaMetaBlocks,
          vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *AttributeBlocks,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *DataSizes,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *WriterDataPositions)

{
  pointer *ppiVar1;
  pointer pcVar2;
  size_t __n;
  iterator __position;
  size_t sVar3;
  iterator iVar4;
  iterator iVar5;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *this_00;
  int iVar6;
  size_t *psVar7;
  long lVar8;
  long lVar9;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>>
  *this_01;
  bool bVar10;
  bool bVar11;
  long lVar12;
  MetaMetaInfoBlock *o;
  MetaMetaInfoBlock *pMVar13;
  uint64_t element;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *__range4;
  MetaMetaInfoBlock local_a8;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *local_88;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>>
  *local_80;
  long local_78;
  size_t local_70;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  ulong local_58;
  vector<char,_std::allocator<char>_> *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((Counts->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (Counts->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_58 = 0;
    lVar9 = 0;
    local_88 = __return_storage_ptr__;
    local_80 = (vector<adios2::format::BP5Base::MetaMetaInfoBlock,std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>>
                *)UniqueMetaMetaBlocks;
    local_68 = AttributeBlocks;
    local_60 = Counts;
    local_50 = Aggregate;
    do {
      local_48 = *(long *)((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar9);
      lVar9 = lVar9 + 8;
      if (local_48 != 0) {
        lVar12 = 0;
        this_01 = local_80;
        do {
          pcVar2 = (Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          __n = *(size_t *)(pcVar2 + lVar9);
          local_70 = *(size_t *)(pcVar2 + lVar9 + 8);
          local_78 = __n + lVar9 + 0x10;
          lVar9 = lVar9 + 0x10;
          pMVar13 = *(MetaMetaInfoBlock **)this_01;
          __position._M_current = *(MetaMetaInfoBlock **)(this_01 + 8);
          if (pMVar13 == __position._M_current) {
LAB_006286fd:
            local_a8.MetaMetaInfo = pcVar2 + local_78;
            local_a8.MetaMetaInfoLen = local_70;
            local_a8.MetaMetaID = pcVar2 + lVar9;
            local_a8.MetaMetaIDLen = __n;
            if (__position._M_current == *(MetaMetaInfoBlock **)(this_01 + 0x10)) {
              std::
              vector<adios2::format::BP5Base::MetaMetaInfoBlock,std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>>
              ::_M_realloc_insert<adios2::format::BP5Base::MetaMetaInfoBlock_const&>
                        (this_01,__position,&local_a8);
            }
            else {
              (__position._M_current)->MetaMetaID = local_a8.MetaMetaID;
              (__position._M_current)->MetaMetaIDLen = __n;
              (__position._M_current)->MetaMetaInfo = local_a8.MetaMetaInfo;
              (__position._M_current)->MetaMetaInfoLen = local_70;
              *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x20;
            }
          }
          else {
            bVar10 = false;
            bVar11 = false;
            local_40 = lVar9;
            local_38 = lVar12;
            do {
              if (pMVar13->MetaMetaIDLen == __n) {
                iVar6 = bcmp(pMVar13->MetaMetaID,pcVar2 + lVar9,__n);
                bVar11 = bVar10;
                if (iVar6 == 0) {
                  bVar10 = true;
                  bVar11 = true;
                }
              }
              pMVar13 = pMVar13 + 1;
            } while (pMVar13 != __position._M_current);
            lVar9 = local_40;
            this_01 = local_80;
            lVar12 = local_38;
            if (!bVar11) goto LAB_006286fd;
          }
          lVar9 = local_78 + local_70;
          lVar12 = lVar12 + 1;
          Aggregate = local_50;
        } while (lVar12 != local_48);
      }
      this_00 = local_68;
      __return_storage_ptr__ = local_88;
      lVar12 = lVar9 + 8;
      for (lVar9 = *(long *)((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar9); lVar9 != 0;
          lVar9 = lVar9 + -1) {
        psVar7 = (size_t *)
                 ((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start + lVar12);
        local_a8.MetaMetaInfo = (char *)(psVar7 + 1);
        sVar3 = *psVar7;
        iVar4._M_current =
             (__return_storage_ptr__->
             super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_a8.MetaMetaInfoLen = sVar3;
        if (iVar4._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::
          _M_realloc_insert<adios2::core::iovec>(__return_storage_ptr__,iVar4,(iovec *)&local_a8);
        }
        else {
          (iVar4._M_current)->iov_base = local_a8.MetaMetaInfo;
          (iVar4._M_current)->iov_len = sVar3;
          ppiVar1 = &(__return_storage_ptr__->
                     super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppiVar1 = *ppiVar1 + 1;
        }
        lVar12 = lVar12 + 8 + sVar3;
      }
      lVar9 = lVar12 + 8;
      for (lVar12 = *(long *)((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_start + lVar12); lVar12 != 0;
          lVar12 = lVar12 + -1) {
        psVar7 = (size_t *)
                 ((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start + lVar9);
        local_a8.MetaMetaInfo = (char *)(psVar7 + 1);
        sVar3 = *psVar7;
        iVar4._M_current =
             (this_00->super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_a8.MetaMetaInfoLen = sVar3;
        if (iVar4._M_current ==
            (this_00->super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::
          _M_realloc_insert<adios2::core::iovec>(this_00,iVar4,(iovec *)&local_a8);
        }
        else {
          (iVar4._M_current)->iov_base = local_a8.MetaMetaInfo;
          (iVar4._M_current)->iov_len = sVar3;
          ppiVar1 = &(this_00->
                     super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppiVar1 = *ppiVar1 + 1;
        }
        lVar9 = lVar9 + 8 + sVar3;
      }
      lVar12 = *(long *)((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar9);
      if (lVar12 == 0) {
        lVar8 = lVar9 + 8;
      }
      else {
        do {
          lVar8 = lVar9;
          local_a8.MetaMetaInfo =
               *(char **)((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar8 + 8);
          iVar5._M_current =
               (DataSizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (DataSizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)DataSizes,iVar5,
                       (unsigned_long *)&local_a8);
          }
          else {
            *iVar5._M_current = (unsigned_long)local_a8.MetaMetaInfo;
            (DataSizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          lVar9 = lVar8 + 8;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        lVar8 = lVar8 + 0x10;
      }
      lVar9 = lVar9 + 0x10;
      for (lVar12 = *(long *)((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_start + lVar8); lVar12 != 0;
          lVar12 = lVar12 + -1) {
        local_a8.MetaMetaInfo =
             *(char **)((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar9);
        iVar5._M_current =
             (WriterDataPositions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (WriterDataPositions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)WriterDataPositions,
                     iVar5,(unsigned_long *)&local_a8);
        }
        else {
          *iVar5._M_current = (unsigned_long)local_a8.MetaMetaInfo;
          (WriterDataPositions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        lVar9 = lVar9 + 8;
      }
      local_58 = local_58 + 1;
    } while (local_58 <
             (ulong)((long)(local_60->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_60->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<core::iovec> BP5Serializer::BreakoutContiguousMetadata(
    std::vector<char> &Aggregate, const std::vector<size_t> Counts,
    std::vector<MetaMetaInfoBlock> &UniqueMetaMetaBlocks, std::vector<core::iovec> &AttributeBlocks,
    std::vector<uint64_t> &DataSizes, std::vector<uint64_t> &WriterDataPositions) const
{
    size_t Position = 0;
    std::vector<core::iovec> MetadataBlocks;
    // MetadataBlocks.reserve(Counts.size());
    // DataSizes.resize(Counts.size());
    for (size_t Rank = 0; Rank < Counts.size(); Rank++)
    {
        uint64_t NMMBCount, MBCount, ABCount, DSCount, WDPCount;
        helper::CopyFromBuffer(Aggregate.data(), Position, &NMMBCount);
        for (uint64_t i = 0; i < NMMBCount; i++)
        {
            uint64_t IDLen;
            uint64_t InfoLen;
            helper::CopyFromBuffer(Aggregate.data(), Position, &IDLen);
            helper::CopyFromBuffer(Aggregate.data(), Position, &InfoLen);
            uint64_t IDPosition = Position;
            uint64_t InfoPosition = Position + IDLen;
            Position = InfoPosition + InfoLen;
            bool Found = 0;
            for (auto &o : UniqueMetaMetaBlocks)
            {
                if (o.MetaMetaIDLen != IDLen)
                    continue;
                if (std::memcmp(o.MetaMetaID, Aggregate.data() + IDPosition, IDLen) == 0)
                    Found = true;
            }
            if (!Found)
            {
                MetaMetaInfoBlock New = {Aggregate.data() + InfoPosition, InfoLen,
                                         Aggregate.data() + IDPosition, IDLen};
                UniqueMetaMetaBlocks.push_back(New);
            }
        }
        helper::CopyFromBuffer(Aggregate.data(), Position, &MBCount);
        for (uint64_t i = 0; i < MBCount; ++i)
        {
            uint64_t MEBSize;
            helper::CopyFromBuffer(Aggregate.data(), Position, &MEBSize);
            MetadataBlocks.push_back({Aggregate.data() + Position, MEBSize});
            Position += MEBSize;
        }
        helper::CopyFromBuffer(Aggregate.data(), Position, &ABCount);
        for (uint64_t i = 0; i < ABCount; ++i)
        {
            uint64_t AEBSize;
            helper::CopyFromBuffer(Aggregate.data(), Position, &AEBSize);
            AttributeBlocks.push_back({Aggregate.data() + Position, AEBSize});
            Position += AEBSize;
        }
        uint64_t element;
        helper::CopyFromBuffer(Aggregate.data(), Position, &DSCount);
        for (uint64_t i = 0; i < DSCount; ++i)
        {
            helper::CopyFromBuffer(Aggregate.data(), Position, &element);
            DataSizes.push_back(element);
        }
        helper::CopyFromBuffer(Aggregate.data(), Position, &WDPCount);
        for (uint64_t i = 0; i < WDPCount; ++i)
        {
            helper::CopyFromBuffer(Aggregate.data(), Position, &element);
            WriterDataPositions.push_back(element);
        }
    }
    return MetadataBlocks;
}